

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_enable_msi(int device_fd)

{
  __off_t __offset;
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  size_t sVar8;
  void *pvVar9;
  int __timeout;
  epoll_event *__events;
  code *pcVar10;
  undefined4 uVar11;
  ulong uVar12;
  char *__buf;
  undefined1 *puVar13;
  undefined1 *puVar14;
  epoll_event *peVar15;
  long lVar16;
  char *pcVar17;
  char irq_set_buf [24];
  char buf [512];
  undefined8 auStack_3550 [2];
  size_t asStack_3540 [67];
  long lStack_3328;
  int iStack_3320;
  uint uStack_331c;
  undefined8 uStack_3318;
  undefined1 auStack_3310 [512];
  stat sStack_3110;
  char acStack_3080 [4096];
  char acStack_2080 [4096];
  ulong auStack_1080 [3];
  epoll_event aeStack_1064 [33];
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  epoll_event aeStack_e40 [32];
  undefined1 auStack_c40 [8];
  ulong uStack_c38;
  undefined1 *puStack_c30;
  char *pcStack_c28;
  char *pcStack_c20;
  char *pcStack_c18;
  code *pcStack_c10;
  ulong uStack_c08;
  int iStack_c00;
  undefined4 uStack_bfc;
  undefined1 auStack_bf8 [520];
  ulong uStack_9f0;
  undefined1 auStack_920 [512];
  code *pcStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  uint uStack_708;
  int iStack_704;
  undefined1 auStack_678 [512];
  ulong uStack_478;
  undefined1 auStack_440 [512];
  code *pcStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined4 local_228;
  int local_224;
  undefined1 local_218 [520];
  
  pcStack_240 = (code *)0x107233;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x30,
          "vfio_enable_msi");
  pcStack_240 = (code *)0x10723c;
  iVar2 = eventfd(0,0);
  local_228 = 1;
  local_238 = 0x2400000018;
  uStack_230 = 1;
  pcStack_240 = (code *)0x107265;
  local_224 = iVar2;
  iVar3 = ioctl(device_fd,0x3b6e);
  if (iVar3 != -1) {
    return iVar2;
  }
  puVar13 = local_218;
  pcStack_240 = vfio_disable_msi;
  vfio_enable_msi_cold_1();
  pcStack_240 = (code *)(ulong)(uint)device_fd;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x4b,
          "vfio_disable_msi");
  uVar5 = 0x3b6e;
  iVar2 = ioctl((int)puVar13,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar14 = auStack_440;
  vfio_disable_msi_cold_1();
  pcStack_720 = (code *)0x10732e;
  uStack_478 = (ulong)puVar13 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x60,
          "vfio_enable_msix");
  pcStack_720 = (code *)0x107337;
  iVar2 = eventfd(0,0);
  uVar4 = 0x21;
  if (uVar5 < 0x21) {
    uVar4 = uVar5;
  }
  uStack_708 = 1;
  if (uVar5 != 0) {
    uStack_708 = uVar4;
  }
  uStack_718 = 0x2400000098;
  uStack_710 = 2;
  pcStack_720 = (code *)0x107374;
  iStack_704 = iVar2;
  iVar3 = ioctl((int)puVar14,0x3b6e);
  if (iVar3 != -1) {
    return iVar2;
  }
  puVar13 = auStack_678;
  pcStack_720 = vfio_disable_msix;
  vfio_enable_msix_cold_1();
  pcStack_720 = (code *)((ulong)puVar14 & 0xffffffff);
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar2 = ioctl((int)puVar13,0x3b6e);
  if (iVar2 != -1) {
    return 0;
  }
  puVar14 = auStack_920;
  vfio_disable_msix_cold_1();
  pcVar17 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c";
  pcStack_c10 = (code *)0x10744e;
  uStack_9f0 = (ulong)puVar13 & 0xffffffff;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar10 = (code *)0x2;
  while( true ) {
    uVar12 = 0x3b6d;
    uStack_c08 = 0x10;
    iVar3 = (int)pcVar10;
    uStack_bfc = 0;
    pcStack_c10 = (code *)0x107482;
    iStack_c00 = iVar3;
    iVar2 = ioctl((int)puVar14,0x3b6d,&uStack_c08);
    if (iVar2 == -1) break;
    if ((uStack_c08 & 0x100000000) != 0) goto LAB_001074b7;
    pcStack_c10 = (code *)0x1074ad;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    pcVar10 = (code *)(ulong)(iVar3 - 1);
    if (iVar3 == 0) {
      pcVar10 = (code *)0xffffffff;
LAB_001074b7:
      return (int)pcVar10;
    }
  }
  iVar2 = (int)auStack_bf8;
  pcStack_c10 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_1();
  pcStack_c18 = "vfio_setup_interrupt";
  pcStack_c20 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
  ;
  pcStack_c28 = "[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n";
  lVar1 = -((uVar12 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_e40 + lVar1);
  uStack_c38 = (ulong)puVar14 & 0xffffffff;
  puStack_c30 = (undefined1 *)&uStack_c08;
  pcStack_c10 = pcVar10;
  *(undefined8 *)((long)&uStack_e48 + lVar1) = 0x107510;
  uVar5 = epoll_wait(iVar2,__events,(int)uVar12,__timeout);
  if (uVar5 != 0xffffffff) {
    pcVar17 = (char *)(ulong)uVar5;
    if (0 < (int)uVar5) {
      lVar16 = 0;
      do {
        iVar2 = *(int *)((long)aeStack_e40 + lVar16 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_e48 + lVar1) = 0x107540;
        sVar7 = read(iVar2,auStack_c40,8);
        if (sVar7 == -1) {
          *(undefined8 *)((long)&uStack_e48 + lVar1) = 0x10756d;
          vfio_epoll_wait_cold_1();
          goto LAB_0010756d;
        }
        lVar16 = lVar16 + 0xc;
      } while ((long)pcVar17 * 0xc != lVar16);
    }
    return uVar5;
  }
LAB_0010756d:
  peVar15 = aeStack_e40;
  *(code **)((long)&uStack_e48 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_e48 + lVar1) = &pcStack_c10;
  *(epoll_event **)((long)&uStack_e50 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_1064 + lVar1) = 1;
  *(int *)((long)aeStack_1064 + lVar1 + 4) = (int)peVar15;
  *(undefined8 *)((long)auStack_1080 + lVar1 + 0x10) = 0x107597;
  uVar5 = epoll_create1(0);
  if (uVar5 == 0xffffffff) {
    *(undefined8 *)((long)auStack_1080 + lVar1 + 0x10) = 0x1075cc;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar5;
    *(undefined8 *)((long)auStack_1080 + lVar1 + 0x10) = 0x1075b1;
    iVar2 = epoll_ctl(uVar5,1,(int)peVar15,(epoll_event *)((long)aeStack_1064 + lVar1));
    if (iVar2 != -1) {
      return uVar5;
    }
  }
  lVar16 = (long)aeStack_1064 + lVar1 + 0xc;
  *(code **)((long)auStack_1080 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_1080 + lVar1 + 0x10) = (ulong)peVar15 & 0xffffffff;
  *(char **)((long)auStack_1080 + lVar1 + 8) = pcVar17;
  *(epoll_event **)((long)auStack_1080 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107605;
  snprintf(acStack_2080 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar16);
  *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107615;
  iVar2 = stat(acStack_2080 + lVar1,(stat *)((long)&sStack_3110 + lVar1));
  if (iVar2 < 0) {
    return -1;
  }
  pcVar17 = acStack_2080 + lVar1;
  *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10762d;
  sVar8 = strlen(pcVar17);
  *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107644;
  strncat(pcVar17,"iommu_group",0xfff - sVar8);
  __buf = acStack_3080 + lVar1;
  *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107659;
  sVar7 = readlink(pcVar17,__buf,0x1000);
  uVar11 = SUB84(__buf,0);
  if (sVar7 == -1) {
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1077ee;
    vfio_init_cold_11();
LAB_001077ee:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1077f8;
    vfio_init_cold_10();
LAB_001077f8:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107802;
    vfio_init_cold_8();
LAB_00107802:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10780c;
    vfio_init_cold_7();
LAB_0010780c:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107816;
    vfio_init_cold_6();
LAB_00107816:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107820;
    vfio_init_cold_5();
LAB_00107820:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10782a;
    vfio_init_cold_3();
LAB_0010782a:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107834;
    vfio_init_cold_9();
LAB_00107834:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10783e;
    vfio_init_cold_1();
LAB_0010783e:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107848;
    vfio_init_cold_2();
  }
  else {
    acStack_3080[(int)sVar7 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10767a;
    pcVar17 = __xpg_basename(acStack_3080 + lVar1);
    uVar11 = 0x1084e4;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107690;
    iVar2 = __isoc99_sscanf(pcVar17,"%d",(long)&uStack_331c + lVar1);
    if (iVar2 == -1) goto LAB_001077ee;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1076a0;
    iVar2 = get_vfio_container();
    *(int *)((long)&iStack_3320 + lVar1) = iVar2;
    if (iVar2 == -1) {
      uVar11 = 2;
      *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1076bd;
      iVar3 = open("/dev/vfio/vfio",2);
      if (iVar3 == -1) goto LAB_0010782a;
      *(int *)((long)&iStack_3320 + lVar1) = iVar3;
      *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1076d3;
      set_vfio_container(iVar3);
      uVar11 = 0x3b64;
      *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1076e2;
      iVar6 = ioctl(iVar3,0x3b64);
      if (iVar6 != 0) goto LAB_00107834;
      uVar11 = 0x3b65;
      *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1076fe;
      iVar3 = ioctl(iVar3,0x3b65,1);
      if (iVar3 == 1) goto LAB_00107707;
      goto LAB_0010783e;
    }
LAB_00107707:
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107729;
    snprintf(acStack_2080 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_331c + lVar1)
            );
    uVar11 = 2;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107738;
    iVar3 = open(acStack_2080 + lVar1,2);
    if (iVar3 == -1) goto LAB_001077f8;
    uVar11 = 0x3b67;
    *(undefined8 *)((long)&uStack_3318 + lVar1) = 8;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x10775e;
    iVar6 = ioctl(iVar3,0x3b67);
    if (iVar6 == -1) goto LAB_00107802;
    if ((auStack_3310[lVar1 + -4] & 1) == 0) goto LAB_0010780c;
    uVar11 = 0x3b68;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x107784;
    iVar6 = ioctl(iVar3,0x3b68,(long)&iStack_3320 + lVar1);
    if (iVar6 == -1) goto LAB_00107816;
    if (iVar2 != -1) {
LAB_001077af:
      uVar11 = 0x3b6a;
      *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1077c1;
      iVar2 = ioctl(iVar3,0x3b6a,lVar16);
      if (iVar2 != -1) {
        *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1077cf;
        vfio_enable_dma(iVar2);
        return iVar2;
      }
      goto LAB_00107820;
    }
    uVar11 = 0x3b66;
    *(undefined8 *)((long)&lStack_3328 + lVar1) = 0x1077a6;
    iVar2 = ioctl(*(int *)((long)&iStack_3320 + lVar1),0x3b66,1);
    if (iVar2 != -1) goto LAB_001077af;
  }
  iVar2 = (int)auStack_3310 + (int)lVar1;
  *(code **)((long)&lStack_3328 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_3328 + lVar1) = lVar16;
  *(undefined8 *)((long)auStack_3550 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_3540 + lVar1) = 0;
  *(undefined8 *)((long)asStack_3540 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_3540 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_3540 + lVar1) = uVar11;
  *(undefined8 *)((long)auStack_3550 + lVar1) = 0x10787d;
  iVar3 = ioctl(iVar2,0x3b6c);
  if (iVar3 != -1) {
    sVar8 = *(size_t *)((long)asStack_3540 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_3540 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_3550 + lVar1) = 0x1078a0;
    pvVar9 = mmap((void *)0x0,sVar8,3,1,iVar2,__offset);
    if (pvVar9 != (void *)0xffffffffffffffff) goto LAB_001078b7;
    *(undefined8 *)((long)auStack_3550 + lVar1) = 0x1078b0;
    vfio_map_region_cold_1();
  }
  pvVar9 = (void *)0xffffffffffffffff;
LAB_001078b7:
  return (int)pvVar9;
}

Assistant:

int vfio_enable_msi(int device_fd) {
	info("Enable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 1;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	*fd_ptr = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSI interrupts");

	return event_fd;
}